

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

Gia_Man_t * Au_ManDeriveTest(Abc_Ntk_t *pRoot)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Au_Man_t *pAVar2;
  Abc_Nam_t *pAVar3;
  Gia_Man_t *__ptr;
  Vec_Ptr_t *vOrder;
  Au_Ntk_t *pAVar4;
  Abc_Des_t *pAVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int level;
  long lVar11;
  timespec ts;
  timespec local_60;
  Gia_Man_t *local_50;
  Au_Man_t *local_48;
  Abc_Ntk_t *local_40;
  long local_38;
  
  iVar1 = clock_gettime(3,&local_60);
  lVar8 = 1;
  local_38 = 1;
  if (-1 < iVar1) {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_38 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  iVar1 = clock_gettime(3,&local_60);
  if (-1 < iVar1) {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  pAVar5 = (Abc_Des_t *)&pRoot->pName;
  if (pRoot->pDesign != (Abc_Des_t *)0x0) {
    pAVar5 = pRoot->pDesign;
  }
  pAVar2 = Au_ManAlloc(pAVar5->pName);
  pAVar3 = Abc_NamStart(100,0x10);
  pAVar2->pFuncs = pAVar3;
  local_48 = pAVar2;
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  lVar6 = lVar6 + lVar8;
  __ptr = (Gia_Man_t *)Abc_NtkCollectHie(pRoot);
  if (((Vec_Ptr_t *)__ptr)->nSize < 1) {
    pAVar4 = (Au_Ntk_t *)0x0;
  }
  else {
    lVar8 = 0;
    local_50 = __ptr;
    local_40 = pRoot;
    do {
      pNtk = *(Abc_Ntk_t **)((long)local_50->pSpec + lVar8 * 8);
      vOrder = Abc_NtkDfsBoxes(pNtk);
      iVar1 = clock_gettime(3,&local_60);
      if (iVar1 < 0) {
        lVar7 = 1;
      }
      else {
        lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
        lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_60.tv_sec * -1000000;
      }
      pAVar4 = Au_NtkDerive(local_48,pNtk,vOrder);
      pNtk->iStep = pAVar4->Id;
      pNtk->pData = pAVar4;
      iVar1 = clock_gettime(3,&local_60);
      if (iVar1 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
      }
      if (vOrder->pArray != (void **)0x0) {
        free(vOrder->pArray);
        vOrder->pArray = (void **)0x0;
      }
      if (vOrder != (Vec_Ptr_t *)0x0) {
        free(vOrder);
      }
      lVar6 = lVar6 + lVar7 + lVar10;
      lVar8 = lVar8 + 1;
      __ptr = local_50;
      pRoot = local_40;
    } while (lVar8 < *(int *)((long)local_50 + 4));
  }
  if (((Vec_Ptr_t *)__ptr)->pArray != (void **)0x0) {
    free(((Vec_Ptr_t *)__ptr)->pArray);
    ((Vec_Ptr_t *)__ptr)->pArray = (void **)0x0;
  }
  if (__ptr != (Gia_Man_t *)0x0) {
    free(__ptr);
  }
  pAVar2 = local_48;
  Au_ManReorderModels(local_48,pAVar4);
  Au_ManPrintStats(pAVar2);
  Au_ManCountThings(pAVar4->pMan);
  pAVar4 = Au_ManFindNtkP(pAVar2,"path_0_r_x_lhs");
  if (pAVar4 == (Au_Ntk_t *)0x0) {
    pAVar4 = (Au_Ntk_t *)0x0;
    printf("Could not find module \"%s\".\n","path_0_r_x_lhs");
  }
  if (pAVar4 == (Au_Ntk_t *)0x0) {
    pAVar4 = (Au_Ntk_t *)pRoot->pData;
  }
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  local_50 = Au_NtkDeriveFlatGia(pAVar4);
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  Au_ManDelete(local_48);
  iVar1 = clock_gettime(3,&local_60);
  lVar9 = -1;
  lVar11 = -1;
  if (-1 < iVar1) {
    lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  level = 3;
  iVar1 = clock_gettime(3,&local_60);
  if (-1 < iVar1) {
    lVar9 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  lVar9 = lVar9 + local_38;
  Abc_Print(level,"%s =","Time all ");
  Abc_Print(level,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  Abc_Print(level,"%s =","Time new ");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar10 + lVar6 + lVar11) / 1000000.0);
  Abc_Print(level,"%s =","Time GIA ");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar7 + lVar8) / 1000000.0);
  return local_50;
}

Assistant:

Gia_Man_t * Au_ManDeriveTest( Abc_Ntk_t * pRoot )
{
    extern Vec_Ptr_t * Abc_NtkCollectHie( Abc_Ntk_t * pNtk );

//    char * pModelName = NULL;
    char * pModelName = "path_0_r_x_lhs";
    Gia_Man_t * pGia = NULL;
    Vec_Ptr_t * vOrder, * vModels;
    Abc_Ntk_t * pMod;
    Au_Man_t * pMan;
    Au_Ntk_t * pNtk = NULL;
    abctime clk1, clk2 = 0, clk3 = 0, clk = Abc_Clock();
    int i;

    clk1 = Abc_Clock();
    pMan = Au_ManAlloc( pRoot->pDesign ? pRoot->pDesign->pName : pRoot->pName );
    pMan->pFuncs = Abc_NamStart( 100, 16 );
    clk2 += Abc_Clock() - clk1;

    vModels = Abc_NtkCollectHie( pRoot );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pMod, i )
    {
        vOrder = Abc_NtkDfsBoxes( pMod );

        clk1 = Abc_Clock();
        pNtk = Au_NtkDerive( pMan, pMod, vOrder );
        pMod->iStep = pNtk->Id;
        pMod->pData = pNtk;
        clk2 += Abc_Clock() - clk1;

        Vec_PtrFree( vOrder );
    }
    Vec_PtrFree( vModels );
    // order models in topological order
    Au_ManReorderModels( pMan, pNtk );

    // print statistics
    Au_ManPrintStats( pMan );
    Au_ManCountThings( pNtk->pMan );

    // select network
    if ( pModelName )
    {
        pNtk = Au_ManFindNtkP( pMan, pModelName );
        if ( pNtk == NULL )
            printf( "Could not find module \"%s\".\n", pModelName );
    }
    if ( pNtk == NULL )
        pNtk = (Au_Ntk_t *)pRoot->pData;

  
//    if ( !Abc_NtkCheckRecursive(pRoot) )
    {
        clk1 = Abc_Clock();
        pGia = Au_NtkDeriveFlatGia( pNtk );
        clk3 = Abc_Clock() - clk1;
//        printf( "GIA objects max = %d.\n", pMan->nGiaObjMax );
    }

//    clk1 = Abc_Clock();
//    Au_NtkSuppSizeTest( (Au_Ntk_t *)pRoot->pData );
//    clk4 = Abc_Clock() - clk1;

    clk1 = Abc_Clock();
    Au_ManDelete( pMan );
    clk2 += Abc_Clock() - clk1;
    
    Abc_PrintTime( 1, "Time all ", Abc_Clock() - clk );
    Abc_PrintTime( 1, "Time new ", clk2 );
    Abc_PrintTime( 1, "Time GIA ", clk3 );
//    Abc_PrintTime( 1, "Time supp", clk4 );
    return pGia;
}